

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::UninterpretedOption::_InternalParse
          (UninterpretedOption *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  string *psVar4;
  void *pvVar5;
  bool bVar6;
  UninterpretedOption_NamePart *msg;
  uint uVar7;
  char *field_name;
  char *pcVar8;
  uint32 uVar9;
  Arena *pAVar10;
  UnknownFieldSet *unknown;
  double *p;
  internal *this_04;
  char cVar11;
  uint res;
  char cVar12;
  uint uVar13;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  pair<const_char_*,_unsigned_long> pVar16;
  StringPiece str;
  double *local_38;
  char *ptr_local;
  char *size;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->aggregate_value_;
  this_02 = &this->string_value_;
  this_03 = &this->identifier_value_;
  uVar13 = 0;
  local_38 = (double *)ptr;
  do {
    bVar6 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar6) goto LAB_002ab203;
    bVar1 = *(byte *)local_38;
    res = (uint)bVar1;
    p = (double *)((long)local_38 + 1);
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
      if ((char)*(byte *)p < '\0') {
        pVar14 = internal::ReadTagFallback((char *)local_38,res);
        p = (double *)pVar14.first;
        res = pVar14.second;
      }
      else {
        p = (double *)((long)local_38 + 2);
      }
    }
    cVar12 = '\x04';
    local_38 = p;
    if (p != (double *)0x0) {
      uVar7 = (res >> 3) - 2;
      if (6 < uVar7) goto switchD_002aae76_default;
      field_name = (char *)((long)&switchD_002aae76::switchdataD_00355560 +
                           (long)(int)(&switchD_002aae76::switchdataD_00355560)[uVar7]);
      cVar11 = (char)res;
      switch(res >> 3) {
      case 2:
        if (cVar11 == '\x12') {
          local_38 = (double *)((long)p + -1);
          do {
            local_38 = (double *)((long)local_38 + 1);
            pRVar3 = (this->name_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar3 == (Rep *)0x0) {
LAB_002aae96:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->name_).super_RepeatedPtrFieldBase,
                         (this->name_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002aaea4:
              pRVar3 = (this->name_).super_RepeatedPtrFieldBase.rep_;
              pRVar3->allocated_size = pRVar3->allocated_size + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption_NamePart>
                              ((this->name_).super_RepeatedPtrFieldBase.arena_);
              pRVar3 = (this->name_).super_RepeatedPtrFieldBase.rep_;
              iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
              (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              pRVar3->elements[iVar2] = msg;
            }
            else {
              iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar3->allocated_size <= iVar2) {
                if (pRVar3->allocated_size == (this->name_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002aae96;
                goto LAB_002aaea4;
              }
              (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg = (UninterpretedOption_NamePart *)pRVar3->elements[iVar2];
            }
            local_38 = (double *)
                       internal::ParseContext::
                       ParseMessage<google::protobuf::UninterpretedOption_NamePart>
                                 (ctx,msg,(char *)local_38);
            if (local_38 == (double *)0x0) goto LAB_002ab1b4;
          } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                  (*(byte *)local_38 == 0x12));
LAB_002aaf2b:
          cVar12 = '\x02';
          goto LAB_002ab1b4;
        }
        break;
      case 3:
        if (cVar11 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pAVar10 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          if (this_03->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_03,pAVar10,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          psVar4 = this_03->ptr_;
          local_38 = (double *)internal::InlineGreedyStringParser(psVar4,(char *)local_38,ctx);
          this_04 = (internal *)(psVar4->_M_dataplus)._M_p;
          size = (char *)psVar4->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          pcVar8 = "google.protobuf.UninterpretedOption.identifier_value";
LAB_002ab100:
          str.length_ = (stringpiece_ssize_type)pcVar8;
          str.ptr_ = size;
          internal::VerifyUTF8(this_04,str,field_name);
LAB_002ab1a9:
          cVar12 = (local_38 == (double *)0x0) * '\x02' + '\x02';
          goto LAB_002ab1b4;
        }
        break;
      case 4:
        if (cVar11 == ' ') {
          bVar1 = *(byte *)p;
          pVar15.second = (long)(char)bVar1;
          pVar15.first = (char *)p;
          local_38 = (double *)((long)p + 1);
          if ((long)(char)bVar1 < 0) {
            uVar9 = ((uint)*(byte *)local_38 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)*(byte *)local_38 < '\0') {
              local_38 = p;
              pVar15 = internal::VarintParseSlow64((char *)p,uVar9);
            }
            else {
              pVar15.second._0_4_ = uVar9;
              pVar15.first = (char *)((long)p + 2);
              pVar15.second._4_4_ = 0;
            }
            local_38 = (double *)pVar15.first;
          }
          uVar13 = uVar13 | 8;
          this->positive_int_value_ = pVar15.second;
          goto LAB_002ab1a9;
        }
        break;
      case 5:
        if (cVar11 == '(') {
          bVar1 = *(byte *)p;
          pVar16.second = (long)(char)bVar1;
          pVar16.first = (char *)p;
          local_38 = (double *)((long)p + 1);
          if ((long)(char)bVar1 < 0) {
            uVar9 = ((uint)*(byte *)local_38 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)*(byte *)local_38 < '\0') {
              local_38 = p;
              pVar16 = internal::VarintParseSlow64((char *)p,uVar9);
            }
            else {
              pVar16.second._0_4_ = uVar9;
              pVar16.first = (char *)((long)p + 2);
              pVar16.second._4_4_ = 0;
            }
            local_38 = (double *)pVar16.first;
          }
          uVar13 = uVar13 | 0x10;
          this->negative_int_value_ = pVar16.second;
          goto LAB_002ab1a9;
        }
        break;
      case 6:
        if (cVar11 == '1') {
          uVar13 = uVar13 | 0x20;
          this->double_value_ = *p;
          local_38 = p + 1;
          goto LAB_002aaf2b;
        }
        break;
      case 7:
        if (cVar11 != ':') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pAVar10 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_02,pAVar10,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        local_38 = (double *)internal::InlineGreedyStringParser(this_02->ptr_,(char *)local_38,ctx);
        goto LAB_002ab15e;
      case 8:
        if (cVar11 == 'B') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pAVar10 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_01,pAVar10,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          psVar4 = this_01->ptr_;
          local_38 = (double *)internal::InlineGreedyStringParser(psVar4,(char *)local_38,ctx);
          this_04 = (internal *)(psVar4->_M_dataplus)._M_p;
          size = (char *)psVar4->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          pcVar8 = "google.protobuf.UninterpretedOption.aggregate_value";
          goto LAB_002ab100;
        }
      }
switchD_002aae76_default:
      if (res == 0 || (res & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar12 = '\t';
      }
      else {
        pvVar5 = this_00->ptr_;
        if (((ulong)pvVar5 & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 8);
        }
        local_38 = (double *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
LAB_002ab15e:
        cVar12 = (local_38 == (double *)0x0) * '\x02' + '\x02';
      }
    }
LAB_002ab1b4:
  } while (cVar12 == '\x02');
  if (cVar12 == '\x04') {
    local_38 = (double *)0x0;
  }
LAB_002ab203:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar13;
  return (char *)local_38;
}

Assistant:

const char* UninterpretedOption::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_name(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string identifier_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_identifier_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.UninterpretedOption.identifier_value");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 positive_int_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_positive_int_value(&has_bits);
          positive_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int64 negative_int_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_negative_int_value(&has_bits);
          negative_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional double double_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 49)) {
          _Internal::set_has_double_value(&has_bits);
          double_value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // optional bytes string_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          auto str = _internal_mutable_string_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string aggregate_value = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          auto str = _internal_mutable_aggregate_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.UninterpretedOption.aggregate_value");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}